

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_writer_create_central_dir_header
                  (mz_zip_archive *pZip,mz_uint8 *pDst,mz_uint16 filename_size,mz_uint16 extra_size,
                  mz_uint16 comment_size,mz_uint64 uncomp_size,mz_uint64 comp_size,
                  mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,mz_uint16 dos_time,
                  mz_uint16 dos_date,mz_uint64 local_header_ofs,mz_uint32 ext_attributes)

{
  mz_uint16 v;
  mz_uint16 in_CX;
  mz_uint16 in_DX;
  mz_uint8 *in_RSI;
  mz_uint16 in_R8W;
  mz_uint32 in_R9D;
  undefined2 in_stack_00000010;
  mz_uint16 in_stack_00000028;
  undefined2 in_stack_00000042;
  
  memset(in_RSI,0,0x2e);
  mz_write_le32(in_RSI,0x2014b50);
  v = 0;
  if ((mz_uint16)pDst != 0) {
    v = 0x14;
  }
  mz_write_le16(in_RSI + 6,v);
  mz_write_le16(in_RSI + 8,(mz_uint16)pZip);
  mz_write_le16(in_RSI + 10,(mz_uint16)pDst);
  mz_write_le16(in_RSI + 0xc,in_stack_00000028);
  mz_write_le16(in_RSI + 0xe,(mz_uint16)comp_size);
  mz_write_le32(in_RSI + 0x10,_in_stack_00000010);
  mz_write_le32(in_RSI + 0x14,(mz_uint32)uncomp_size);
  mz_write_le32(in_RSI + 0x18,in_R9D);
  mz_write_le16(in_RSI + 0x1c,in_DX);
  mz_write_le16(in_RSI + 0x1e,in_CX);
  mz_write_le16(in_RSI + 0x20,in_R8W);
  mz_write_le32(in_RSI + 0x26,_method);
  mz_write_le32(in_RSI + 0x2a,uncomp_crc32);
  return 1;
}

Assistant:

static mz_bool mz_zip_writer_create_central_dir_header(mz_zip_archive *pZip, mz_uint8 *pDst, mz_uint16 filename_size, mz_uint16 extra_size, mz_uint16 comment_size, mz_uint64 uncomp_size, mz_uint64 comp_size, mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags, mz_uint16 dos_time, mz_uint16 dos_date, mz_uint64 local_header_ofs, mz_uint32 ext_attributes)
{
  (void)pZip;
  memset(pDst, 0, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_SIG_OFS, MZ_ZIP_CENTRAL_DIR_HEADER_SIG);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_VERSION_NEEDED_OFS, method ? 20 : 0);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_BIT_FLAG_OFS, bit_flags);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_METHOD_OFS, method);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_FILE_TIME_OFS, dos_time);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_FILE_DATE_OFS, dos_date);
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_CRC32_OFS, uncomp_crc32);
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, comp_size);
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, uncomp_size);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_FILENAME_LEN_OFS, filename_size);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_EXTRA_LEN_OFS, extra_size);
  MZ_WRITE_LE16(pDst + MZ_ZIP_CDH_COMMENT_LEN_OFS, comment_size);
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS, ext_attributes);
  MZ_WRITE_LE32(pDst + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_header_ofs);
  return MZ_TRUE;
}